

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O3

raw_ostream * __thiscall
llvm::raw_ostream::write_escaped(raw_ostream *this,StringRef Str,bool UseHexEscapes)

{
  byte bVar1;
  char *pcVar2;
  byte bVar3;
  ulong uVar4;
  byte *pbVar5;
  undefined7 in_register_00000009;
  byte *pbVar6;
  uint uVar7;
  byte *pbVar8;
  byte *extraout_RDX;
  byte *extraout_RDX_00;
  byte *extraout_RDX_01;
  byte *extraout_RDX_02;
  byte *extraout_RDX_03;
  byte *extraout_RDX_04;
  byte *extraout_RDX_05;
  byte *extraout_RDX_06;
  byte *extraout_RDX_07;
  byte *extraout_RDX_08;
  uchar UC;
  ulong unaff_RBP;
  undefined7 uVar10;
  uint uVar11;
  byte *pbVar12;
  byte *pbVar9;
  
  pbVar6 = (byte *)CONCAT71(in_register_00000009,UseHexEscapes);
  pbVar8 = (byte *)Str.Length;
  if (pbVar8 != (byte *)0x0) {
    pbVar12 = (byte *)0x0;
    pbVar9 = pbVar8;
    do {
      bVar1 = Str.Data[(long)pbVar12];
      uVar10 = (undefined7)(unaff_RBP >> 8);
      unaff_RBP = CONCAT71(uVar10,bVar1);
      uVar11 = (uint)bVar1;
      if (bVar1 < 0x22) {
        if (bVar1 == 9) {
          pcVar2 = this->OutBufCur;
          if (pcVar2 < this->OutBufEnd) {
            pbVar6 = (byte *)(pcVar2 + 1);
            this->OutBufCur = (char *)pbVar6;
            *pcVar2 = '\\';
          }
          else {
            write(this,0x5c,pbVar9,(size_t)pbVar6);
            pbVar9 = extraout_RDX_01;
          }
          pcVar2 = this->OutBufCur;
          if (pcVar2 < this->OutBufEnd) {
            pbVar6 = (byte *)(pcVar2 + 1);
            this->OutBufCur = (char *)pbVar6;
            *pcVar2 = 't';
            goto LAB_0018b6b3;
          }
          uVar11 = 0x74;
        }
        else if (bVar1 == 10) {
          pcVar2 = this->OutBufCur;
          if (pcVar2 < this->OutBufEnd) {
            pbVar6 = (byte *)(pcVar2 + 1);
            this->OutBufCur = (char *)pbVar6;
            *pcVar2 = '\\';
          }
          else {
            write(this,0x5c,pbVar9,(size_t)pbVar6);
            pbVar9 = extraout_RDX;
          }
          pcVar2 = this->OutBufCur;
          if (pcVar2 < this->OutBufEnd) {
            pbVar6 = (byte *)(pcVar2 + 1);
            this->OutBufCur = (char *)pbVar6;
            *pcVar2 = 'n';
            goto LAB_0018b6b3;
          }
          uVar11 = 0x6e;
        }
        else {
LAB_0018b431:
          uVar7 = (int)unaff_RBP - 0x20;
          pbVar9 = (byte *)(ulong)uVar7;
          pbVar6 = (byte *)this->OutBufEnd;
          pbVar5 = (byte *)this->OutBufCur;
          if ((byte)uVar7 < 0x5f) {
            if (pbVar5 < pbVar6) {
LAB_0018b695:
              pbVar6 = pbVar5 + 1;
              this->OutBufCur = (char *)pbVar6;
              *pbVar5 = (byte)unaff_RBP;
              goto LAB_0018b6b3;
            }
          }
          else if (UseHexEscapes) {
            if (pbVar5 < pbVar6) {
              pbVar6 = pbVar5 + 1;
              this->OutBufCur = (char *)pbVar6;
              *pbVar5 = 0x5c;
            }
            else {
              write(this,0x5c,pbVar9,(size_t)pbVar6);
              pbVar9 = extraout_RDX_03;
            }
            pcVar2 = this->OutBufCur;
            if (pcVar2 < this->OutBufEnd) {
              this->OutBufCur = pcVar2 + 1;
              *pcVar2 = 'x';
            }
            else {
              write(this,0x78,pbVar9,(size_t)pbVar6);
              pbVar9 = extraout_RDX_05;
            }
            uVar4 = (unaff_RBP & 0xffffffff) >> 4 & 0xf;
            uVar11 = (uint)(byte)((char)uVar4 + 0x37);
            if (bVar1 < 0xa0) {
              uVar11 = (int)uVar4 + 0x30;
            }
            pcVar2 = this->OutBufCur;
            if (pcVar2 < this->OutBufEnd) {
              this->OutBufCur = pcVar2 + 1;
              *pcVar2 = (char)uVar11;
            }
            else {
              write(this,uVar11,pbVar9,(size_t)pcVar2);
            }
            unaff_RBP = CONCAT71(uVar10,bVar1) & 0xffffffffffffff0f;
            uVar7 = (int)unaff_RBP + 0x30U & 0xff;
            pbVar9 = (byte *)(ulong)uVar7;
            uVar11 = (int)unaff_RBP + 0x37U & 0xff;
            if ((byte)unaff_RBP < 10) {
              uVar11 = uVar7;
            }
            pbVar6 = (byte *)this->OutBufCur;
            if (pbVar6 < this->OutBufEnd) {
              pbVar9 = pbVar6 + 1;
              this->OutBufCur = (char *)pbVar9;
              *pbVar6 = (byte)uVar11;
              goto LAB_0018b6b3;
            }
          }
          else {
            if (pbVar5 < pbVar6) {
              this->OutBufCur = (char *)(pbVar5 + 1);
              *pbVar5 = 0x5c;
            }
            else {
              write(this,0x5c,pbVar9,(size_t)pbVar6);
              pbVar9 = extraout_RDX_04;
            }
            bVar3 = (byte)((unaff_RBP & 0xffffffff) >> 6) & 3 | 0x30;
            pbVar6 = (byte *)this->OutBufCur;
            if (pbVar6 < this->OutBufEnd) {
              pbVar9 = pbVar6 + 1;
              this->OutBufCur = (char *)pbVar9;
              *pbVar6 = bVar3;
            }
            else {
              write(this,(uint)bVar3,pbVar9,(size_t)pbVar6);
              pbVar9 = extraout_RDX_06;
            }
            bVar3 = (byte)((unaff_RBP & 0xffffffff) >> 3) & 7 | 0x30;
            pbVar6 = (byte *)this->OutBufCur;
            if (pbVar6 < this->OutBufEnd) {
              pbVar9 = pbVar6 + 1;
              this->OutBufCur = (char *)pbVar9;
              *pbVar6 = bVar3;
            }
            else {
              write(this,(uint)bVar3,pbVar9,(size_t)pbVar6);
              pbVar9 = extraout_RDX_07;
            }
            unaff_RBP = CONCAT71(uVar10,bVar1) & 0xffffffffffffff07 | 0x30;
            pbVar5 = (byte *)this->OutBufCur;
            if (pbVar5 < this->OutBufEnd) goto LAB_0018b695;
            uVar11 = bVar1 & 7 | 0x30;
          }
        }
LAB_0018b6ae:
        write(this,uVar11,pbVar9,(size_t)pbVar6);
        pbVar9 = extraout_RDX_08;
      }
      else if (bVar1 == 0x22) {
        pcVar2 = this->OutBufCur;
        if (pcVar2 < this->OutBufEnd) {
          pbVar6 = (byte *)(pcVar2 + 1);
          this->OutBufCur = (char *)pbVar6;
          *pcVar2 = '\\';
        }
        else {
          write(this,0x5c,pbVar9,(size_t)pbVar6);
          pbVar9 = extraout_RDX_02;
        }
        pcVar2 = this->OutBufCur;
        if (this->OutBufEnd <= pcVar2) {
          uVar11 = 0x22;
          goto LAB_0018b6ae;
        }
        pbVar6 = (byte *)(pcVar2 + 1);
        this->OutBufCur = (char *)pbVar6;
        *pcVar2 = '\"';
      }
      else {
        if (bVar1 != 0x5c) goto LAB_0018b431;
        pcVar2 = this->OutBufCur;
        if (pcVar2 < this->OutBufEnd) {
          pbVar6 = (byte *)(pcVar2 + 1);
          this->OutBufCur = (char *)pbVar6;
          *pcVar2 = '\\';
        }
        else {
          write(this,0x5c,pbVar9,(size_t)pbVar6);
          pbVar9 = extraout_RDX_00;
        }
        pcVar2 = this->OutBufCur;
        if (this->OutBufEnd <= pcVar2) {
          uVar11 = 0x5c;
          goto LAB_0018b6ae;
        }
        pbVar6 = (byte *)(pcVar2 + 1);
        this->OutBufCur = (char *)pbVar6;
        *pcVar2 = '\\';
      }
LAB_0018b6b3:
      pbVar12 = pbVar12 + 1;
    } while (pbVar8 != pbVar12);
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::write_escaped(StringRef Str,
                                        bool UseHexEscapes) {
  for (unsigned char c : Str) {
    switch (c) {
    case '\\':
      *this << '\\' << '\\';
      break;
    case '\t':
      *this << '\\' << 't';
      break;
    case '\n':
      *this << '\\' << 'n';
      break;
    case '"':
      *this << '\\' << '"';
      break;
    default:
      if (isPrint(c)) {
        *this << c;
        break;
      }

      // Write out the escaped representation.
      if (UseHexEscapes) {
        *this << '\\' << 'x';
        *this << hexdigit((c >> 4 & 0xF));
        *this << hexdigit((c >> 0) & 0xF);
      } else {
        // Always use a full 3-character octal escape.
        *this << '\\';
        *this << char('0' + ((c >> 6) & 7));
        *this << char('0' + ((c >> 3) & 7));
        *this << char('0' + ((c >> 0) & 7));
      }
    }
  }

  return *this;
}